

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

void capnp::_::anon_unknown_0::verifyClient(Client *client,int *callCount,WaitScope *waitScope)

{
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  ArrayPtr<const_char> AVar2;
  int local_130;
  bool local_129;
  undefined1 auStack_128 [7];
  bool _kj_shouldLog_1;
  size_t local_120;
  bool local_111;
  undefined1 auStack_110 [7];
  bool _kj_shouldLog;
  size_t local_108;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_100;
  undefined1 local_c8 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Maybe<capnp::MessageSize> local_78;
  undefined1 local_60 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  int origCount;
  WaitScope *waitScope_local;
  int *callCount_local;
  Client *client_local;
  
  request.hook.ptr._4_4_ = *callCount;
  kj::Maybe<capnp::MessageSize>::Maybe(&local_78,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_60,client,&local_78);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_78);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_60,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_60,true);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_100,(int)local_60,__buf,in_RCX,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_c8,&local_100);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)&local_100);
  _auStack_110 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_c8);
  bVar1 = kj::operator==("foo",(StringPtr *)auStack_110);
  if (!bVar1) {
    local_111 = kj::_::Debug::shouldLog(ERROR);
    while (local_111 != false) {
      AVar2 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_c8);
      _auStack_128 = AVar2;
      kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2ab,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", \"foo\", response.getX()"
                 ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
                 (char (*) [4])0xa4c8db,(Reader *)auStack_128);
      local_111 = false;
    }
  }
  if (request.hook.ptr._4_4_ + 1 != *callCount) {
    local_129 = kj::_::Debug::shouldLog(ERROR);
    while (local_129 != false) {
      local_130 = request.hook.ptr._4_4_ + 1;
      kj::_::Debug::log<char_const(&)[48],int,int_const&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x2ac,ERROR,
                 "\"failed: expected \" \"(origCount + 1) == (callCount)\", origCount + 1, callCount"
                 ,(char (*) [48])"failed: expected (origCount + 1) == (callCount)",&local_130,
                 callCount);
      local_129 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_c8);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_60);
  return;
}

Assistant:

void verifyClient(test::TestInterface::Client client, const int& callCount,
                  kj::WaitScope& waitScope) {
  int origCount = callCount;
  auto request = client.fooRequest();
  request.setI(123);
  request.setJ(true);
  auto response = request.send().wait(waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(origCount + 1, callCount);
}